

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwk.h
# Opt level: O1

void Nwk_ManDfs_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = pObj->pMan->nTravIds;
  if (pObj->TravId == iVar3) {
    return;
  }
  pObj->TravId = iVar3;
  if (0 < pObj->nFanins) {
    lVar4 = 0;
    do {
      if (pObj->pFanio[lVar4] == (Nwk_Obj_t *)0x0) break;
      Nwk_ManDfs_rec(pObj->pFanio[lVar4],vNodes);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pObj->nFanins);
  }
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_008995b5;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar3;
  }
LAB_008995b5:
  iVar3 = vNodes->nSize;
  vNodes->nSize = iVar3 + 1;
  vNodes->pArray[iVar3] = pObj;
  return;
}

Assistant:

static inline int         Nwk_ObjIsTravIdCurrent( Nwk_Obj_t * pObj )         { return pObj->TravId == pObj->pMan->nTravIds;     }